

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t archive_read_format_tar_cleanup(archive_read *a)

{
  long in_RDI;
  tar *tar;
  tar *tar_00;
  
  tar_00 = (tar *)**(undefined8 **)(in_RDI + 0x948);
  gnu_clear_sparse_list(tar_00);
  archive_string_free((archive_string *)0x1533f1);
  archive_string_free((archive_string *)0x1533ff);
  archive_string_free((archive_string *)0x15340d);
  archive_string_free((archive_string *)0x15341b);
  archive_string_free((archive_string *)0x153429);
  archive_string_free((archive_string *)0x153437);
  archive_string_free((archive_string *)0x153448);
  archive_string_free((archive_string *)0x153459);
  archive_string_free((archive_string *)0x15346a);
  archive_string_free((archive_string *)0x15347b);
  archive_string_free((archive_string *)0x15348c);
  archive_string_free((archive_string *)0x15349d);
  free(tar_00);
  **(undefined8 **)(in_RDI + 0x948) = 0;
  return L'\0';
}

Assistant:

static int
archive_read_format_tar_cleanup(struct archive_read *a)
{
	struct tar *tar;

	tar = (struct tar *)(a->format->data);
	gnu_clear_sparse_list(tar);
	archive_string_free(&tar->acl_text);
	archive_string_free(&tar->entry_pathname);
	archive_string_free(&tar->entry_pathname_override);
	archive_string_free(&tar->entry_linkpath);
	archive_string_free(&tar->entry_uname);
	archive_string_free(&tar->entry_gname);
	archive_string_free(&tar->line);
	archive_string_free(&tar->pax_global);
	archive_string_free(&tar->pax_header);
	archive_string_free(&tar->longname);
	archive_string_free(&tar->longlink);
	archive_string_free(&tar->localname);
	free(tar);
	(a->format->data) = NULL;
	return (ARCHIVE_OK);
}